

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plot.hpp
# Opt level: O2

DrawSpecs * __thiscall
sciplot::Plot::drawWithVecs<std::valarray<double>,std::vector<double,std::allocator<double>>>
          (Plot *this,string *with,valarray<double> *x,vector<double,_std::allocator<double>_> *vecs
          )

{
  DrawSpecs *pDVar1;
  string use;
  ostringstream datastream;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_288;
  string local_268;
  string local_248;
  size_t local_228;
  string local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  undefined1 *local_1c0;
  undefined8 local_1b8;
  undefined1 local_1b0 [16];
  ostringstream local_1a0 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  gnuplot::writedataset<std::valarray<double>,std::vector<double,std::allocator<double>>>
            ((ostream *)local_1a0,this->m_numdatasets,x,vecs);
  local_1c0 = local_1b0;
  local_1b8 = 0;
  local_1b0[0] = 0;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::append((string *)&this->m_data);
  std::__cxx11::string::~string((string *)&bStack_288);
  std::operator+(&local_200,"\'",&this->m_datafilename);
  std::operator+(&bStack_288,&local_200,"\' index ");
  local_228 = this->m_numdatasets;
  this->m_numdatasets = local_228 + 1;
  internal::str<unsigned_long>(&local_220,&local_228);
  std::operator+(&local_1e0,&bStack_288,&local_220);
  std::__cxx11::string::string((string *)&local_248,(string *)&local_1c0);
  std::__cxx11::string::string((string *)&local_268,(string *)with);
  pDVar1 = draw(this,&local_1e0,&local_248,&local_268);
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&bStack_288);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return pDVar1;
}

Assistant:

inline auto Plot::drawWithVecs(std::string with, const X& x, const Vecs&... vecs) -> DrawSpecs&
{
    // Write the given vectors x and y as a new data set to the stream
    std::ostringstream datastream;
    gnuplot::writedataset(datastream, m_numdatasets, x, vecs...);

    // Set the using string to "" if X is not vector of strings.
    // Otherwise, x contain xtics strings. Set the `using` string
    // so that these are properly used as xtics.
    std::string use;
    if constexpr(internal::isStringVector<X>) {
        const auto nvecs = sizeof...(Vecs);
        use = "0:"; // here, column 0 means the pseudo column with numbers 0, 1, 2, 3...
        for(auto i = 2; i <= nvecs + 1; ++i)
            use += std::to_string(i) + ":"; // this constructs 0:2:3:4:
        use += "xtic(1)"; // this terminates the string with 0:2:3:4:xtic(1), and thus column 1 is used for the xtics
    }

    // Append new data set to existing data
    m_data += datastream.str();

    // Draw the data saved using a data set with index `m_numdatasets`. Increase number of data sets
    return draw("'" + m_datafilename + "' index " + internal::str(m_numdatasets++), use, with);
}